

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

size_t cs_impl::
       hash_if<std::pair<cs_impl::any,_cs_impl::any>,_std::pair<cs_impl::any,_cs_impl::any>,_false>
       ::hash(pair<cs_impl::any,_cs_impl::any> *val)

{
  error *this;
  string local_38;
  
  this = (error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E000F","");
  cov::error::error(this,&local_38);
  __cxa_throw(this,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

static std::size_t hash(const X &val)
		{
			throw cov::error("E000F");
		}